

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

base_learner * cbifyldf_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar9;
  byte bVar10;
  uint64_t uVar11;
  pointer pcVar12;
  float *pfVar13;
  multi_learner *predict;
  vw *pvVar14;
  vw *in_RSI;
  int iVar15;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_RDI;
  learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  multi_learner *base;
  stringstream ss;
  option_group_definition new_options;
  bool cbify_ldf_option;
  free_ptr<cbify> data;
  typed_option<float> *in_stack_fffffffffffff608;
  float __val;
  vw *in_stack_fffffffffffff610;
  string *in_stack_fffffffffffff618;
  typed_option<float> *in_stack_fffffffffffff620;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_fffffffffffff628;
  allocator *in_stack_fffffffffffff630;
  undefined4 in_stack_fffffffffffff640;
  float fVar16;
  undefined4 in_stack_fffffffffffff644;
  float fVar17;
  size_t in_stack_fffffffffffff648;
  undefined4 in_stack_fffffffffffff650;
  undefined4 in_stack_fffffffffffff654;
  typed_option<float> *in_stack_fffffffffffff658;
  undefined1 *this;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  uint uVar18;
  string local_880 [39];
  allocator local_859;
  string local_858 [32];
  float local_838;
  float local_834;
  learner<char,_char> *in_stack_fffffffffffff7d0;
  undefined1 local_820 [383];
  allocator local_6a1;
  string local_6a0 [32];
  string local_680 [39];
  allocator local_659;
  string local_658 [32];
  string local_638 [39];
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [32];
  undefined4 local_578;
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [359];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [359];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  typed_option<bool> local_1e0 [2];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  undefined1 local_29;
  undefined1 local_28 [16];
  vw *local_18;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<cbify>();
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Make csoaa_ldf into Contextual Bandit",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff610,
             (string *)in_stack_fffffffffffff608);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"cbify_ldf",&local_201);
  VW::config::make_option<bool>(in_stack_fffffffffffff618,(bool *)in_stack_fffffffffffff610);
  VW::config::typed_option<bool>::keep(local_1e0,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,"Convert csoaa_ldf into a contextual bandit problem",&local_229);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff610,(string *)in_stack_fffffffffffff608);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_fffffffffffff610,
             (typed_option<bool> *)in_stack_fffffffffffff608);
  VW::config::option_group_definition::add<bool>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
             (typed_option<bool> *)in_stack_fffffffffffff658);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"loss0",&local_391);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28aa56);
  VW::config::make_option<float>(in_stack_fffffffffffff618,(float *)in_stack_fffffffffffff610);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff620,(float)((ulong)in_stack_fffffffffffff618 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"loss for correct label",&local_3b9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff610,(string *)in_stack_fffffffffffff608);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),in_stack_fffffffffffff658
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"loss1",&local_521);
  std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
            ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28ab56);
  VW::config::make_option<float>(in_stack_fffffffffffff618,(float *)in_stack_fffffffffffff610);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff620,(float)((ulong)in_stack_fffffffffffff618 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"loss for incorrect label",&local_549);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff610,(string *)in_stack_fffffffffffff608);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  __val = (float)((ulong)in_stack_fffffffffffff608 >> 0x20);
  VW::config::option_group_definition::add<float>
            ((option_group_definition *)
             CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),in_stack_fffffffffffff658
            );
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff610);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff610);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff610);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff610);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff610);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff610);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  (*(code *)**(undefined8 **)local_10)(local_10,local_68);
  plVar9 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"cbify_ldf",&local_571);
  bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_570);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  if (((bVar10 ^ 0xff) & 1) == 0) {
    uVar11 = uniform_hash((void *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                          in_stack_fffffffffffff648,
                          CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b157);
    pvVar14 = local_18;
    pcVar12->app_seed = uVar11;
    pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                        ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b180);
    plVar9 = local_10;
    pcVar12->all = pvVar14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_598,"cb_explore_adf",&local_599);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_598);
    std::__cxx11::string::~string(local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    plVar9 = local_10;
    if (((bVar10 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,"cb_explore_adf",&local_5c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,"",&local_5e9);
      (**(code **)(*(long *)plVar9 + 0x28))(plVar9,local_5c0,local_5e8);
      std::__cxx11::string::~string(local_5e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    }
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_610,"cb_min_cost",&local_611);
    std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
              ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b40f);
    std::__cxx11::to_string(__val);
    (**(code **)(*(long *)plVar9 + 0x28))(plVar9,local_610,local_638);
    std::__cxx11::string::~string(local_638);
    std::__cxx11::string::~string(local_610);
    std::allocator<char>::~allocator((allocator<char> *)&local_611);
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_658,"cb_max_cost",&local_659);
    std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
              ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b4b7);
    std::__cxx11::to_string(__val);
    (**(code **)(*(long *)plVar9 + 0x28))(plVar9,local_658,local_680);
    std::__cxx11::string::~string(local_680);
    std::__cxx11::string::~string(local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    plVar9 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6a0,"baseline",&local_6a1);
    bVar10 = (**(code **)(*(long *)plVar9 + 8))(plVar9,local_6a0);
    uVar18 = (uint)bVar10 << 0x18;
    std::__cxx11::string::~string(local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
    if ((uVar18 & 0x1000000) != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffff7d0);
      this = local_820;
      iVar15 = (int)local_28;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b5bb);
      std::abs(iVar15);
      iVar15 = (int)local_28;
      std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b5ec);
      std::abs(iVar15);
      pfVar13 = std::max<float>(&local_834,&local_838);
      fVar17 = *pfVar13;
      pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                          ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b64d);
      fVar16 = pcVar12->loss1;
      pcVar12 = std::unique_ptr<cbify,_void_(*)(void_*)>::operator->
                          ((unique_ptr<cbify,_void_(*)(void_*)> *)0x28b665);
      std::ostream::operator<<(this,fVar17 / (fVar16 - pcVar12->loss0));
      in_stack_fffffffffffff630 = &local_859;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_858,"lr_multiplier",in_stack_fffffffffffff630);
      std::__cxx11::stringstream::str();
      (**(code **)(*(long *)local_10 + 0x28))(local_10,local_858,local_880);
      std::__cxx11::string::~string(local_880);
      std::__cxx11::string::~string(local_858);
      std::allocator<char>::~allocator((allocator<char> *)&local_859);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffff7d0);
      in_stack_fffffffffffff628 = local_10;
    }
    in_stack_fffffffffffff620 =
         (typed_option<float> *)
         setup_base((options_i *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
    predict = LEARNER::as_multiline<char,char>(in_stack_fffffffffffff7d0);
    pvVar14 = (vw *)LEARNER::
                    init_learner<cbify,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                              ((free_ptr<cbify> *)in_stack_fffffffffffff630,
                               in_stack_fffffffffffff628,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)in_stack_fffffffffffff620,
                               (_func_void_cbify_ptr_learner<char,_std::vector<example_ptr,_std::allocator<example_ptr>_>_>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                                *)predict,(size_t)in_stack_fffffffffffff610,(prediction_type_t)__val
                              );
    in_stack_fffffffffffff610 = pvVar14;
    LEARNER::learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
              ((learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)
               in_stack_fffffffffffff630,(_func_void_cbify_ptr *)in_stack_fffffffffffff628);
    LEARNER::learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish_example
              ((learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)pvVar14,
               finish_multiline_example);
    ppVar1 = local_18->p;
    (ppVar1->lp).label_size = DAT_00476c88;
    puVar8 = PTR_test_label_00476c80;
    puVar7 = PTR_weight_00476c70;
    puVar6 = PTR_delete_label_00476c68;
    puVar5 = PTR_read_cached_label_00476c60;
    puVar4 = PTR_cache_label_00476c58;
    puVar3 = PTR_parse_label_00476c50;
    puVar2 = COST_SENSITIVE::cs_label;
    (ppVar1->lp).copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_00476c78;
    (ppVar1->lp).test_label = (_func_bool_void_ptr *)puVar8;
    (ppVar1->lp).delete_label = (_func_void_void_ptr *)puVar6;
    (ppVar1->lp).get_weight = (_func_float_void_ptr *)puVar7;
    (ppVar1->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)puVar4;
    (ppVar1->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)puVar5;
    (ppVar1->lp).default_label = (_func_void_void_ptr *)puVar2;
    (ppVar1->lp).parse_label =
         (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)puVar3;
    local_18->delete_prediction = (_func_void_void_ptr *)0x0;
    local_8 = LEARNER::make_base<cbify,std::vector<example*,std::allocator<example*>>>
                        ((learner<cbify,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                         pvVar14);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_578 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff610);
  std::unique_ptr<cbify,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<cbify,_void_(*)(void_*)> *)in_stack_fffffffffffff620);
  return local_8;
}

Assistant:

base_learner* cbifyldf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cbify>();
  bool cbify_ldf_option = false;

  option_group_definition new_options("Make csoaa_ldf into Contextual Bandit");
  new_options
      .add(make_option("cbify_ldf", cbify_ldf_option).keep().help("Convert csoaa_ldf into a contextual bandit problem"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify_ldf"))
    return nullptr;

  data->app_seed = uniform_hash("vw", 2, 0);
  data->all = &all;

  if (!options.was_supplied("cb_explore_adf"))
  {
    options.insert("cb_explore_adf", "");
  }
  options.insert("cb_min_cost", to_string(data->loss0));
  options.insert("cb_max_cost", to_string(data->loss1));

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  learner<cbify,multi_ex>& l = init_learner(data, base, do_actual_learning_ldf<true>, do_actual_learning_ldf<false>, 1, prediction_type::multiclass);

  l.set_finish(finish);
  l.set_finish_example(finish_multiline_example);
  all.p->lp = COST_SENSITIVE::cs_label;
  all.delete_prediction = nullptr;

  return make_base(l);
}